

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

float TcDistanceHelper(ON_2fPoint *tc)

{
  float fVar1;
  float fVar2;
  
  fVar1 = tc->x;
  fVar1 = (float)(~-(uint)(0.5 < fVar1) & (uint)fVar1 | (uint)(1.0 - fVar1) & -(uint)(0.5 < fVar1));
  fVar2 = 0.0;
  if (0.0 <= fVar1) {
    fVar2 = tc->y;
    fVar2 = (float)(~-(uint)(0.5 < fVar2) & (uint)fVar2 | (uint)(1.0 - fVar2) & -(uint)(0.5 < fVar2)
                   );
    if (fVar2 <= fVar1) {
      fVar1 = fVar2;
    }
    fVar2 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar1);
  }
  return fVar2;
}

Assistant:

static
float TcDistanceHelper(const ON_2fPoint& tc)
{
  float dx = (tc.x > 0.5f) ? (1.0f-tc.x) : tc.x;
  if ( dx < 0.0f)
    return 0.0f;
  float dy = (tc.y > 0.5f) ? (1.0f-tc.y) : tc.y;
  if ( dy < 0.0f)
    return 0.0f;
  return (dx < dy) ? dx : dy;
}